

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetUserArray
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  _func_int **pp_Var2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PField *pPVar6;
  DObject *self;
  char *pcVar7;
  bool bVar8;
  FName local_24;
  PClass *pPVar5;
  
  pPVar3 = DObject::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003db495;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (DObject *)0x0) {
        pPVar5 = self->Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**self->_vptr_DObject)(self);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          self->Class = pPVar5;
        }
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))";
          goto LAB_003db495;
        }
        goto LAB_003db3f4;
      }
    }
    else if (self != (DObject *)0x0) goto LAB_003db485;
    self = (DObject *)0x0;
LAB_003db3f4:
    if (numparam == 1) {
      pcVar7 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if (numparam < 3) {
          pcVar7 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            if (numparam == 3) {
              pcVar7 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\0') {
                iVar4 = param[2].field_0.i;
                iVar1 = param[3].field_0.i;
                pPVar6 = GetArrayVar(self,&local_24,iVar4);
                if (pPVar6 != (PField *)0x0) {
                  pp_Var2 = pPVar6->Type[1].super_PTypeBase.super_DObject._vptr_DObject;
                  (**(code **)(*pp_Var2 + 0x78))
                            (pp_Var2,(long)&self->_vptr_DObject +
                                     (ulong)(uint)(iVar4 * *(int *)((long)&pPVar6->Type[1].
                                                                           super_PTypeBase.
                                                                           super_DObject.Class + 4))
                                     + pPVar6->Offset,iVar1);
                }
                return 0;
              }
              pcVar7 = "param[paramnum].Type == REGT_INT";
            }
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x133e,
                          "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar7 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x133d,
                      "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar7 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133c,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003db485:
  pcVar7 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003db495:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x133b,
                "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetUserArray)
{
	PARAM_SELF_PROLOGUE(DObject);
	PARAM_NAME	(varname);
	PARAM_INT	(pos);
	PARAM_INT	(value);

	// Set the value of the specified user array at index pos.
	PField *var = GetArrayVar(self, varname, pos);
	if (var != nullptr)
	{
		PArray *arraytype = static_cast<PArray *>(var->Type);
		arraytype->ElementType->SetValue(reinterpret_cast<BYTE *>(self) + var->Offset + arraytype->ElementSize * pos, value);
	}
	return 0;
}